

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch_tests.cpp
# Opt level: O0

void check_patch<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *target,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *patch,
               error_code *expected_ec,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  bool bVar1;
  type_conflict9 tVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ExprLhs<const_std::error_code_&> EVar4;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  error_code ec;
  error_code *in_stack_00000790;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000798;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000007a0;
  undefined4 in_stack_fffffffffffffe28;
  Flags in_stack_fffffffffffffe2c;
  AssertionHandler *in_stack_fffffffffffffe30;
  AssertionHandler *this;
  StringRef *in_stack_fffffffffffffe38;
  AssertionHandler *this_00;
  char *in_stack_fffffffffffffe48;
  size_type in_stack_fffffffffffffe50;
  error_code *in_stack_fffffffffffffe60;
  ExprLhs<const_std::error_code_&> *in_stack_fffffffffffffe68;
  AssertionHandler local_160;
  error_code *local_e0;
  SourceLineInfo local_88;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  
  std::error_code::error_code((error_code *)in_stack_fffffffffffffe30);
  jsoncons::jsonpatch::
  apply_patch<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (in_stack_000007a0,in_stack_00000798,in_stack_00000790);
  bVar1 = std::operator!=((error_code *)in_stack_fffffffffffffe30,
                          (error_code *)
                          CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  if ((bVar1) ||
     (tVar2 = jsoncons::operator!=
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe30,
                         (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)), tVar2)) {
    std::operator<<((ostream *)&std::cout,"target:\n");
    pbVar3 = jsoncons::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::operator<<(pbVar3,'\n');
  }
  local_88 = (SourceLineInfo)
             operator____catch_sr
                       ((char *)in_stack_fffffffffffffe30,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  this_00 = (AssertionHandler *)&stack0xffffffffffffff68;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpatch/src/jsonpatch_tests.cpp"
             ,0x1d);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)in_stack_fffffffffffffe38);
  capturedExpression.m_size = in_stack_fffffffffffffe50;
  capturedExpression.m_start = in_stack_fffffffffffffe48;
  Catch::AssertionHandler::AssertionHandler
            (this_00,in_stack_fffffffffffffe38,(SourceLineInfo *)in_stack_fffffffffffffe30,
             capturedExpression,in_stack_fffffffffffffe2c);
  EVar4 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (error_code *)0x547b6f);
  local_e0 = EVar4.m_lhs;
  Catch::ExprLhs<std::error_code_const&>::operator==
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffe30,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  Catch::BinaryExpr<const_std::error_code_&,_const_std::error_code_&>::~BinaryExpr
            ((BinaryExpr<const_std::error_code_&,_const_std::error_code_&> *)0x547bc6);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffe30);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe30);
  local_160.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffe30,
                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  this = &local_160;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpatch/src/jsonpatch_tests.cpp"
             ,0x1e);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)in_stack_fffffffffffffe38);
  capturedExpression_00.m_size = in_stack_fffffffffffffe50;
  capturedExpression_00.m_start = (char *)EVar4.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (this_00,in_stack_fffffffffffffe38,(SourceLineInfo *)this,capturedExpression_00,
             in_stack_fffffffffffffe2c);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x547ccb);
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==((ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)in_stack_fffffffffffffe68,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_fffffffffffffe60);
  Catch::AssertionHandler::handleExpr
            (this,(ITransientExpression *)
                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0x547d13);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  return;
}

Assistant:

void check_patch(Json& target, const Json& patch, const std::error_code& expected_ec, const Json& expected)
{
    std::error_code ec;
    jsonpatch::apply_patch(target, patch, ec);
    if (ec != expected_ec || expected != target)
    {
        std::cout << "target:\n" << target << '\n';
    }
    CHECK(ec == expected_ec); //-V521
    CHECK(expected == target); //-V521
}